

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

bool __thiscall
metaf::VisibilityGroup::appendVariableMeters
          (VisibilityGroup *this,string *group,IncompleteText next)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  int iVar2;
  Type TVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  Modifier MVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  smatch match;
  ulong local_90;
  string_type local_80;
  ulong local_60;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  
  if ((appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)::
       rgx_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                                   ::rgx_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                ::rgx_abi_cxx11_,"(\\d\\d\\d\\d)V(\\d\\d\\d\\d)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                  ::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                         ::rgx_abi_cxx11_);
  }
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin._M_current = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (group->_M_dataplus)._M_p;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + group->_M_string_length),&local_58,
                     &appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                      ::rgx_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_80,&local_58,1);
    if (local_80._M_string_length == 4) {
      iVar2 = std::__cxx11::string::compare((char *)&local_80);
      if (iVar2 == 0) {
        bVar1 = true;
        uVar10 = 0;
        local_90 = 0;
        bVar9 = 0;
      }
      else {
        if (local_80._M_string_length < 4) goto LAB_001a7d61;
        lVar5 = 0;
        uVar4 = 0;
        do {
          if ((byte)(local_80._M_dataplus._M_p[lVar5] - 0x3aU) < 0xf6) goto LAB_001a7d61;
          uVar4 = (uint)(byte)(local_80._M_dataplus._M_p[lVar5] - 0x30) + uVar4 * 10;
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 != 4);
        local_90 = 10000;
        if (uVar4 != 9999) {
          local_90 = (ulong)uVar4;
        }
        uVar10 = (ulong)((uint)(uVar4 == 9999) * 2);
        bVar9 = 1;
        bVar1 = true;
      }
    }
    else {
LAB_001a7d61:
      uVar10 = 0;
      local_90 = 0;
      bVar9 = 0;
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_80,&local_58,2);
      local_60 = uVar10;
      if (local_80._M_string_length == 4) {
        iVar2 = std::__cxx11::string::compare((char *)&local_80);
        if (iVar2 == 0) {
          bVar6 = 1;
          MVar7 = NONE;
          uVar10 = 0;
          bVar8 = 0;
        }
        else {
          if (local_80._M_string_length < 4) goto LAB_001a7e3a;
          lVar5 = 0;
          uVar4 = 0;
          do {
            if ((byte)(local_80._M_dataplus._M_p[lVar5] - 0x3aU) < 0xf6) goto LAB_001a7e3a;
            uVar4 = (uint)(byte)(local_80._M_dataplus._M_p[lVar5] - 0x30) + uVar4 * 10;
            lVar5 = lVar5 + 1;
          } while ((int)lVar5 != 4);
          uVar10 = 10000;
          if (uVar4 != 9999) {
            uVar10 = (ulong)uVar4;
          }
          MVar7 = (uint)(uVar4 == 9999) * 2;
          bVar8 = 1;
          bVar6 = 1;
        }
      }
      else {
LAB_001a7e3a:
        MVar7 = NONE;
        uVar10 = 0;
        bVar8 = 0;
        bVar6 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar1 = false;
      if ((bVar6 & bVar9 & bVar8) == 0) goto LAB_001a7e49;
      (this->vis).distModifier = (Modifier)local_60;
      (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_payload_base<unsigned_int>)(((ulong)bVar9 << 0x20) + local_90);
      (this->vis).distUnit = METERS;
      (this->visMax).distModifier = MVar7;
      (this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_payload_base<unsigned_int>)((ulong)bVar8 << 0x20 | uVar10);
      (this->visMax).distUnit = METERS;
      TVar3 = this->visType;
      if (TVar3 == PREVAILING) {
        TVar3 = VARIABLE_PREVAILING;
LAB_001a7f58:
        this->visType = TVar3;
      }
      else {
        if (TVar3 == SECTOR) {
          TVar3 = VARIABLE_SECTOR;
          goto LAB_001a7f58;
        }
        if (TVar3 == DIRECTIONAL) {
          TVar3 = VARIABLE_DIRECTIONAL;
          goto LAB_001a7f58;
        }
      }
      this->incompleteText = next;
      bVar1 = true;
      goto LAB_001a7e49;
    }
  }
  bVar1 = false;
LAB_001a7e49:
  if (local_58.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool VisibilityGroup::appendVariableMeters(const std::string & group, IncompleteText next) {
	static const std::regex rgx("(\\d\\d\\d\\d)V(\\d\\d\\d\\d)");
	static const auto matchMin = 1, matchMax = 2;
	std::smatch match;
	if (!std::regex_match(group, match, rgx)) return false;
	const auto min = Distance::fromMeterString(match.str(matchMin));
	if (!min.has_value()) return false;
	const auto max = Distance::fromMeterString(match.str(matchMax));
	if (!max.has_value()) return false;
	if (!min->isReported() || !max->isReported()) return false;
	vis = *min;
	visMax = *max;
	makeVariable();
	incompleteText = next;
	return true;
}